

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O1

float find_max_RGBE(uchar *image,int width,int height)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  
  if (width * height < 1) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    iVar3 = width * height;
    do {
      dVar4 = ldexp(0.003921568859368563,image[3] - 0x80);
      lVar2 = -3;
      fVar6 = fVar5;
      do {
        fVar5 = (float)image[lVar2 + 3] * (float)dVar4;
        if ((float)image[lVar2 + 3] * (float)dVar4 <= fVar6) {
          fVar5 = fVar6;
        }
        lVar2 = lVar2 + 1;
        fVar6 = fVar5;
      } while (lVar2 != 0);
      image = image + 4;
      bVar1 = 1 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar1);
  }
  return fVar5;
}

Assistant:

float
find_max_RGBE
(
	unsigned char *image,
    int width, int height
)
{
	float max_val = 0.0f;
	unsigned char *img = image;
	int i, j;
	for( i = width * height; i > 0; --i )
	{
		/* float scale = powf( 2.0f, img[3] - 128.0f ) / 255.0f; */
		float scale = ldexp( 1.0f / 255.0f, (int)(img[3]) - 128 );
		for( j = 0; j < 3; ++j )
		{
			if( img[j] * scale > max_val )
			{
				max_val = img[j] * scale;
			}
		}
		/* next pixel */
		img += 4;
	}
	return max_val;
}